

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_sub(sexp ctx,sexp a,sexp b)

{
  sexp_tag_t sVar1;
  ulong uVar2;
  bool bVar3;
  sexp *ppsVar4;
  sexp *ppsVar5;
  sexp *ppsVar6;
  sexp *ppsVar7;
  sexp a_00;
  sexp psVar8;
  sexp psVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  sexp tmp1;
  sexp tmp2;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_78;
  double local_70;
  sexp local_68;
  void *local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_58.var = &local_78;
  if (((ulong)a & 3) == 0) {
    uVar10 = 0;
    if ((ulong)a->tag < 0x11) {
      uVar10 = sexp_number_types[a->tag];
    }
  }
  else {
    uVar10 = (uint)a & 1;
  }
  if (((ulong)b & 3) == 0) {
    uVar11 = 0;
    if ((ulong)b->tag < 0x11) {
      uVar11 = sexp_number_types[b->tag];
    }
  }
  else {
    uVar11 = (uint)b & 1;
  }
  a_00 = (sexp)&DAT_0000043e;
  local_78 = (sexp)&DAT_0000043e;
  local_48.next = &local_58;
  local_48.var = &local_68;
  local_68 = (sexp)0x43e;
  local_58.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_48.next;
  (ctx->value).context.saves = &local_48;
  bVar3 = true;
  psVar8 = a;
  psVar9 = b;
  ppsVar4 = &local_78;
  ppsVar5 = &local_78;
  ppsVar6 = &local_78;
  ppsVar7 = &local_78;
  switch(uVar11 + uVar10 * 6) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
    b = a;
    goto LAB_0011adce;
  case 6:
  case 0xc:
  case 0x12:
  case 0x18:
  case 0x1e:
LAB_0011adce:
    local_58.var = &local_78;
    a_00 = sexp_type_exception(ctx,(sexp)0x0,3,b);
    goto switchD_0011adb0_default;
  case 7:
    a_00 = (sexp)((long)a + (1 - (long)b));
    goto switchD_0011adb0_default;
  case 8:
    if (a != (sexp)&DAT_00000001) {
      dVar15 = (double)((long)a >> 1);
      local_58.var = &local_78;
      goto LAB_0011b0d4;
    }
    dVar15 = -(double)(b->value).stack.length;
    local_58.var = &local_78;
    break;
  case 9:
    local_58.var = &local_78;
    local_78 = sexp_fixnum_to_bignum(ctx,a);
    psVar9 = sexp_bignum_sub(ctx,(sexp)0x0,b,local_78);
    if ((((ulong)psVar9 & 3) == 0) && (psVar9->tag == 0xc)) {
      (psVar9->value).flonum_bits[0] = -(psVar9->value).flonum_bits[0];
    }
    else if (((ulong)psVar9 & 1) != 0) {
      psVar9 = (sexp)(1 - ((ulong)psVar9 & 0xfffffffffffffffe));
    }
    goto LAB_0011b07d;
  case 10:
  case 0x16:
    b = a;
    goto LAB_0011adea;
  case 0xb:
  case 0x11:
  case 0x17:
    goto switchD_0011adb0_caseD_b;
  case 0xd:
    dVar15 = (a->value).flonum - (double)((long)b >> 1);
    local_58.var = &local_78;
    break;
  case 0xe:
    dVar15 = (a->value).flonum;
    local_58.var = &local_78;
    goto LAB_0011b0d4;
  case 0xf:
    local_70 = (a->value).flonum;
    local_58.var = &local_78;
    dVar15 = sexp_bignum_to_double(b);
    uVar13 = SUB84(dVar15,0);
    uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
    goto LAB_0011b09e;
  case 0x10:
    local_70 = (a->value).flonum;
    local_58.var = &local_78;
    dVar15 = sexp_ratio_to_double(ctx,b);
    uVar13 = SUB84(dVar15,0);
    uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
LAB_0011b09e:
    dVar15 = local_70 - (double)CONCAT44(uVar14,uVar13);
    break;
  case 0x13:
    local_58.var = &local_78;
    b = sexp_fixnum_to_bignum(ctx,b);
    local_78 = b;
    goto LAB_0011b078;
  case 0x14:
    local_58.var = &local_78;
    dVar15 = sexp_bignum_to_double(a);
    goto LAB_0011b0d4;
  case 0x15:
    local_58.var = &local_78;
LAB_0011b078:
    psVar9 = sexp_bignum_sub(ctx,(sexp)0x0,a,b);
LAB_0011b07d:
    a_00 = sexp_bignum_normalize(psVar9);
    goto switchD_0011adb0_default;
  case 0x19:
  case 0x1b:
    bVar3 = false;
    psVar9 = a;
    local_78 = a;
LAB_0011adea:
    local_58.var = &local_78;
    a = sexp_make_ratio(ctx,b,(sexp)&DAT_00000003);
    local_78 = a;
    ppsVar4 = local_58.var;
switchD_0011adb0_caseD_1c:
    local_58.var = ppsVar4;
    local_68 = sexp_make_ratio(ctx,(psVar9->value).type.name,(psVar9->value).type.cpl);
    psVar9 = (local_68->value).type.name;
    if ((((ulong)psVar9 & 3) == 0) && (psVar9->tag == 0xc)) {
      uVar12 = (psVar9->value).string.offset;
      local_70 = (double)(uVar12 * 8);
      psVar8 = sexp_alloc_tagged_aux(ctx,uVar12 * 8 + 0x18,0xc);
      (psVar8->value).string.offset = uVar12;
      uVar2 = (psVar9->value).string.offset;
      if (uVar2 < uVar12) {
        uVar12 = uVar2;
      }
      (psVar8->value).flonum_bits[0] = (psVar9->value).flonum_bits[0];
      local_60 = (void *)((long)&psVar8->value + 0x10);
      memset(local_60,0,(size_t)local_70);
      memmove(local_60,(void *)((long)&psVar9->value + 0x10),uVar12 << 3);
      (local_68->value).type.name = psVar8;
    }
    psVar9 = (local_68->value).type.name;
    if ((((ulong)psVar9 & 3) == 0) && (psVar9->tag == 0xc)) {
      (psVar9->value).flonum_bits[0] = -(psVar9->value).flonum_bits[0];
    }
    else if (((ulong)psVar9 & 1) != 0) {
      (local_68->value).type.name = (sexp)(1 - ((ulong)psVar9 & 0xfffffffffffffffe));
    }
    a_00 = sexp_ratio_add(ctx,a,local_68);
    if (bVar3) goto switchD_0011adb0_default;
    if (((ulong)a_00 & 3) == 0) {
      sVar1 = a_00->tag;
      if (sVar1 == 0xb) goto switchD_0011afaa_caseD_b;
      if (sVar1 == 0xc) goto switchD_0011afaa_caseD_c;
      if (sVar1 != 0xd) goto switchD_0011afaa_default;
      goto switchD_0011afaa_caseD_d;
    }
    goto switchD_0011afaa_default;
  case 0x1a:
    local_58.var = &local_78;
    dVar15 = sexp_ratio_to_double(ctx,a);
LAB_0011b0d4:
    dVar15 = dVar15 - (b->value).flonum;
    break;
  case 0x1c:
    goto switchD_0011adb0_caseD_1c;
  case 0x1d:
    local_58.var = &local_78;
    dVar15 = sexp_ratio_to_double(ctx,a);
    a = sexp_make_flonum(ctx,dVar15);
    local_78 = a;
    ppsVar5 = local_58.var;
  case 0x23:
switchD_0011adb0_caseD_23:
    local_58.var = ppsVar5;
    a_00 = sexp_complex_sub(ctx,a,b);
    if (bVar3) goto switchD_0011adb0_default;
    if (((ulong)a_00 & 3) == 0) {
      switch(a_00->tag) {
      case 0xb:
switchD_0011afaa_caseD_b:
        (a_00->value).stack.length = (a_00->value).stack.length ^ 0x8000000000000000;
        break;
      case 0xc:
switchD_0011afaa_caseD_c:
        (a_00->value).flonum_bits[0] = -(a_00->value).flonum_bits[0];
        break;
      case 0xd:
switchD_0011afaa_caseD_d:
        psVar9 = (a_00->value).type.name;
        if ((((ulong)psVar9 & 3) != 0) || (psVar9->tag != 0xc)) {
          if (((ulong)psVar9 & 1) != 0) {
            (a_00->value).type.name = (sexp)(1 - ((ulong)psVar9 & 0xfffffffffffffffe));
          }
          break;
        }
LAB_0011b127:
        (psVar9->value).flonum_bits[0] = -(psVar9->value).flonum_bits[0];
        break;
      case 0xe:
        a_00 = sexp_complex_copy(ctx,a_00);
        psVar9 = (a_00->value).type.name;
        if (((ulong)psVar9 & 3) == 0) {
          if (psVar9->tag == 0xd) {
            psVar8 = (psVar9->value).type.name;
            if ((((ulong)psVar8 & 3) == 0) && (psVar8->tag == 0xc)) {
              (psVar8->value).flonum_bits[0] = -(psVar8->value).flonum_bits[0];
            }
            else if (((ulong)psVar8 & 1) != 0) {
              (psVar9->value).type.name = (sexp)(1 - ((ulong)psVar8 & 0xfffffffffffffffe));
            }
          }
          else {
            if (((ulong)psVar9 & 3) != 0) goto LAB_0011b16c;
            if (psVar9->tag == 0xb) {
              (psVar9->value).stack.length = (psVar9->value).stack.length ^ 0x8000000000000000;
            }
            else {
              if ((((ulong)psVar9 & 3) != 0) || (psVar9->tag != 0xc)) goto LAB_0011b16c;
              (psVar9->value).flonum_bits[0] = -(psVar9->value).flonum_bits[0];
            }
          }
        }
        else {
LAB_0011b16c:
          if (((ulong)psVar9 & 1) != 0) {
            (a_00->value).type.name = (sexp)(1 - ((ulong)psVar9 & 0xfffffffffffffffe));
          }
        }
        psVar9 = (a_00->value).type.cpl;
        if (((ulong)psVar9 & 3) == 0) {
          if (psVar9->tag == 0xd) {
            psVar8 = (psVar9->value).type.name;
            if ((((ulong)psVar8 & 3) == 0) && (psVar8->tag == 0xc)) {
              (psVar8->value).flonum_bits[0] = -(psVar8->value).flonum_bits[0];
            }
            else if (((ulong)psVar8 & 1) != 0) {
              (psVar9->value).type.name = (sexp)(1 - ((ulong)psVar8 & 0xfffffffffffffffe));
            }
            break;
          }
          if (((ulong)psVar9 & 3) == 0) {
            if (psVar9->tag == 0xb) {
              (psVar9->value).stack.length = (psVar9->value).stack.length ^ 0x8000000000000000;
              break;
            }
            if ((((ulong)psVar9 & 3) == 0) && (psVar9->tag == 0xc)) goto LAB_0011b127;
          }
        }
        if (((ulong)psVar9 & 1) != 0) {
          (a_00->value).type.cpl = (sexp)(1 - ((ulong)psVar9 & 0xfffffffffffffffe));
        }
        break;
      default:
        goto switchD_0011afaa_default;
      }
    }
    else {
switchD_0011afaa_default:
      if (((ulong)a_00 & 1) != 0) {
        a_00 = (sexp)(1 - ((ulong)a_00 & 0xfffffffffffffffe));
      }
    }
    goto switchD_0011adb0_default;
  case 0x1f:
  case 0x20:
  case 0x21:
    goto switchD_0011adb0_caseD_1f;
  case 0x22:
    dVar15 = sexp_ratio_to_double(ctx,b);
    b = sexp_make_flonum(ctx,dVar15);
    ppsVar6 = local_58.var;
    goto switchD_0011adb0_caseD_1f;
  default:
    goto switchD_0011adb0_default;
  }
  a_00 = sexp_make_flonum(ctx,dVar15);
switchD_0011adb0_default:
  (ctx->value).context.saves = local_58.next;
  return a_00;
switchD_0011adb0_caseD_1f:
  local_58.var = ppsVar6;
  psVar8 = b;
  bVar3 = false;
  b = a;
  local_78 = a;
  ppsVar7 = local_58.var;
switchD_0011adb0_caseD_b:
  local_58.var = ppsVar7;
  a = sexp_make_complex(ctx,psVar8,(sexp)&DAT_00000001);
  local_78 = a;
  ppsVar5 = local_58.var;
  goto switchD_0011adb0_caseD_23;
}

Assistant:

sexp sexp_sub (sexp ctx, sexp a, sexp b) {
#if SEXP_USE_FLONUMS
  int negatep=0;
#endif
  int at=sexp_number_type(a), bt=sexp_number_type(b);
  sexp r=SEXP_VOID;
  sexp_gc_var2(tmp1, tmp2);
  sexp_gc_preserve2(ctx, tmp1, tmp2);
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_NOT_RAT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_NOT_CPX:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
    break;
  case SEXP_NUM_FIX_NOT: case SEXP_NUM_FLO_NOT: case SEXP_NUM_BIG_NOT:
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_NOT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_CPX_NOT:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, b);
    break;
  case SEXP_NUM_FIX_FIX:
    r = sexp_fx_sub(a, b);      /* VM catches this case */
    break;
  case SEXP_NUM_FIX_FLO:
    r = sexp_make_flonum(ctx, a==SEXP_ZERO ? -sexp_flonum_value(b) : sexp_fixnum_to_double(a)-sexp_flonum_value(b));
    break;
  case SEXP_NUM_FIX_BIG:
    tmp1 = sexp_fixnum_to_bignum(ctx, a);
    r = sexp_bignum_sub(ctx, NULL, b, tmp1);
    sexp_negate_exact(r);
    r = sexp_bignum_normalize(r);
    break;
  case SEXP_NUM_FLO_FIX:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) - sexp_fixnum_to_double(b));
    break;
  case SEXP_NUM_FLO_FLO:
    r = sexp_fp_sub(ctx, a, b);
    break;
  case SEXP_NUM_FLO_BIG:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) - sexp_bignum_to_double(b));
    break;
  case SEXP_NUM_BIG_FIX:
    tmp1 = sexp_fixnum_to_bignum(ctx, b);
    r = sexp_bignum_normalize(sexp_bignum_sub(ctx, NULL, a, tmp1));
    break;
  case SEXP_NUM_BIG_FLO:
    r = sexp_make_flonum(ctx, sexp_bignum_to_double(a) - sexp_flonum_value(b));
    break;
  case SEXP_NUM_BIG_BIG:
    r = sexp_bignum_normalize(sexp_bignum_sub(ctx, NULL, a, b));
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) - sexp_ratio_to_double(ctx, b));
    break;
  case SEXP_NUM_RAT_FLO:
    r = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, a) - sexp_flonum_value(b));
    break;
  case SEXP_NUM_RAT_FIX:
  case SEXP_NUM_RAT_BIG:
    tmp1 = a; a = b; b = tmp1;
    negatep = 1;
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_FIX_RAT:
  case SEXP_NUM_BIG_RAT:
    a = tmp1 = sexp_make_ratio(ctx, a, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_RAT_RAT:
    tmp2 = sexp_make_ratio(ctx, sexp_ratio_numerator(b), sexp_ratio_denominator(b));
    if (sexp_bignump(sexp_ratio_numerator(tmp2)))
      sexp_ratio_numerator(tmp2) = sexp_copy_bignum(ctx, NULL, sexp_ratio_numerator(tmp2), 0);
    sexp_negate_exact(sexp_ratio_numerator(tmp2));
    r = sexp_ratio_add(ctx, a, tmp2);
    if (negatep) {
      sexp_negate_maybe_ratio(r);
    }
    break;
#endif
#if SEXP_USE_COMPLEX
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_CPX:
    a = tmp1 = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, a));
    goto complex_sub;
  case SEXP_NUM_CPX_RAT:
    b = tmp1 = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, b));
    /* ... FALLTHROUGH ... */
#endif
  case SEXP_NUM_CPX_FLO:
  case SEXP_NUM_CPX_FIX:
  case SEXP_NUM_CPX_BIG:
    tmp1 = a; a = b; b = tmp1;
    negatep = 1;
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_FLO_CPX:
  case SEXP_NUM_FIX_CPX:
  case SEXP_NUM_BIG_CPX:
    a = tmp1 = sexp_make_complex(ctx, a, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_CPX_CPX:
#if SEXP_USE_RATIOS
  complex_sub:
#endif
    r = sexp_complex_sub(ctx, a, b);
    if (negatep) {
      if (sexp_complexp(r)) {
        r = sexp_complex_copy(ctx, r);
        sexp_negate_maybe_ratio(sexp_complex_real(r));
        sexp_negate_maybe_ratio(sexp_complex_imag(r));
      } else {
        sexp_negate_maybe_ratio(r);
      }
    }
    break;
#endif
  }
  sexp_gc_release2(ctx);
  return r;
}